

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rr_cache.hpp
# Opt level: O0

void __thiscall
cappuccino::
rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
::do_insert(rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
            *this,unsigned_long *key,
           basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false>,_bool>
  pVar5;
  element *e;
  _Node_iterator<std::pair<const_unsigned_long,_unsigned_long>,_false,_false> keyed_position;
  value_type element_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  unsigned_long *key_local;
  rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>
  *this_local;
  
  uVar1 = this->m_open_list_end;
  sVar2 = std::
          vector<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
          ::size(&this->m_elements);
  if (sVar2 <= uVar1) {
    do_prune(this);
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_open_list,this->m_open_list_end);
  keyed_position.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
  _M_cur = (_Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>)*pvVar3;
  pVar5 = std::
          unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
          ::emplace<unsigned_long_const&,unsigned_long&>
                    ((unordered_map<unsigned_long,unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                      *)&this->m_keyed_elements,key,(unsigned_long *)&keyed_position);
  pvVar4 = std::
           vector<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element,_std::allocator<cappuccino::rr_cache<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(cappuccino::thread_safe)1>::element>_>
           ::operator[](&this->m_elements,
                        (size_type)
                        keyed_position.
                        super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>
                        ._M_cur);
  std::__cxx11::string::operator=((string *)&pvVar4->m_value,(string *)value);
  pvVar4->m_open_list_position = this->m_open_list_end;
  (pvVar4->m_keyed_position).
  super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>._M_cur =
       (__node_type *)
       pVar5.first.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>.
       _M_cur.super__Node_iterator_base<std::pair<const_unsigned_long,_unsigned_long>,_false>;
  this->m_open_list_end = this->m_open_list_end + 1;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value) -> void
    {
        if (m_open_list_end >= m_elements.size())
        {
            do_prune();
        }

        auto element_idx = m_open_list[m_open_list_end];

        auto keyed_position = m_keyed_elements.emplace(key, element_idx).first;

        element& e             = m_elements[element_idx];
        e.m_value              = std::move(value);
        e.m_open_list_position = m_open_list_end;
        e.m_keyed_position     = keyed_position;

        ++m_open_list_end;
    }